

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# materials.cpp
# Opt level: O0

CoatedDiffuseMaterial *
pbrt::CoatedDiffuseMaterial::Create
          (TextureParameterDictionary *parameters,FileLoc *loc,Allocator alloc)

{
  Allocator alloc_00;
  Allocator alloc_01;
  Allocator alloc_02;
  Allocator alloc_03;
  bool bVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  CoatedDiffuseMaterial *pCVar5;
  undefined8 in_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  bool remapRoughness;
  FloatTextureHandle displacement;
  SpectrumTextureHandle albedo;
  FloatTextureHandle g;
  LayeredBxDFConfig config;
  FloatTextureHandle eta;
  FloatTextureHandle thickness;
  FloatTextureHandle vRoughness;
  FloatTextureHandle uRoughness;
  SpectrumTextureHandle reflectance;
  string *in_stack_fffffffffffffb78;
  TextureParameterDictionary *in_stack_fffffffffffffb80;
  ConstantSpectrum **in_stack_fffffffffffffb88;
  polymorphic_allocator<std::byte> *in_stack_fffffffffffffb90;
  string *in_stack_fffffffffffffb98;
  SpectrumType spectrumType;
  TextureParameterDictionary *in_stack_fffffffffffffba0;
  undefined7 in_stack_fffffffffffffba8;
  undefined1 in_stack_fffffffffffffbaf;
  TextureParameterDictionary *in_stack_fffffffffffffbb0;
  Allocator in_stack_fffffffffffffbb8;
  FloatTextureHandle *args_3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  FloatTextureHandle *args_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args;
  string *in_stack_fffffffffffffbd8;
  string *name;
  TextureParameterDictionary *in_stack_fffffffffffffbe0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  Allocator in_stack_fffffffffffffbe8;
  Allocator AVar6;
  FloatTextureHandle *args_5;
  undefined4 in_stack_fffffffffffffc08;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_7;
  allocator<char> *args_8;
  undefined4 in_stack_fffffffffffffc20;
  undefined8 local_351;
  byte local_329;
  undefined8 local_328;
  undefined8 local_319;
  undefined4 local_2ec;
  ConstantSpectrum *local_2e8;
  undefined8 local_2d8;
  undefined1 local_2c1 [33];
  TaggedPointer local_2a0 [8];
  undefined8 local_298;
  undefined8 local_289;
  undefined8 local_259;
  allocator<char> local_231;
  string local_230 [39];
  allocator<char> local_209;
  string local_208 [37];
  LayeredBxDFConfig local_1e3;
  undefined8 local_1e0;
  allocator<char> local_1d1;
  string local_1d0 [40];
  undefined8 local_1a8;
  allocator<char> local_199;
  string local_198 [40];
  undefined8 local_170;
  allocator<char> local_161;
  string local_160 [40];
  undefined8 local_138;
  allocator<char> local_129;
  string local_128 [40];
  undefined8 local_100;
  allocator<char> local_f1;
  string local_f0 [32];
  TaggedPointer local_d0 [8];
  undefined8 local_c8;
  allocator<char> local_b9;
  string local_b8 [32];
  TaggedPointer local_98 [12];
  undefined4 local_8c;
  ConstantSpectrum *local_88;
  undefined8 local_78;
  allocator<char> local_51;
  string local_50 [32];
  TaggedPointer local_30 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_20;
  undefined8 local_18;
  
  local_20 = in_RDI;
  local_18 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbc0,(char *)in_stack_fffffffffffffbb8.memoryResource,
             (allocator<char> *)in_stack_fffffffffffffbb0);
  SpectrumHandle::TaggedPointer
            ((SpectrumHandle *)in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  local_78 = local_18;
  TextureParameterDictionary::GetSpectrumTexture
            (in_stack_fffffffffffffbb0,
             (string *)CONCAT17(in_stack_fffffffffffffbaf,in_stack_fffffffffffffba8),
             (SpectrumHandle *)in_stack_fffffffffffffba0,
             (SpectrumType)((ulong)in_stack_fffffffffffffb98 >> 0x20),in_stack_fffffffffffffbb8);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  bVar1 = pbrt::TaggedPointer::operator_cast_to_bool(local_30);
  if (!bVar1) {
    local_8c = 0x3f000000;
    local_88 = pstd::pmr::polymorphic_allocator<std::byte>::new_object<pbrt::ConstantSpectrum,float>
                         (in_stack_fffffffffffffb90,(float *)in_stack_fffffffffffffb88);
    pstd::pmr::polymorphic_allocator<std::byte>::
    new_object<pbrt::SpectrumConstantTexture,pbrt::ConstantSpectrum*>
              (in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
    SpectrumTextureHandle::TaggedPointer<pbrt::SpectrumConstantTexture>
              ((SpectrumTextureHandle *)in_stack_fffffffffffffb80,
               (SpectrumConstantTexture *)in_stack_fffffffffffffb78);
    SpectrumTextureHandle::operator=
              ((SpectrumTextureHandle *)in_stack_fffffffffffffb80,
               (SpectrumTextureHandle *)in_stack_fffffffffffffb78);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbc0,(char *)in_stack_fffffffffffffbb8.memoryResource,
             (allocator<char> *)in_stack_fffffffffffffbb0);
  local_c8 = local_18;
  TextureParameterDictionary::GetFloatTextureOrNull
            (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,in_stack_fffffffffffffbe8);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator(&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbc0,(char *)in_stack_fffffffffffffbb8.memoryResource,
             (allocator<char> *)in_stack_fffffffffffffbb0);
  local_100 = local_18;
  TextureParameterDictionary::GetFloatTextureOrNull
            (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,in_stack_fffffffffffffbe8);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator(&local_f1);
  bVar1 = pbrt::TaggedPointer::operator_cast_to_bool(local_98);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffbc0,(char *)in_stack_fffffffffffffbb8.memoryResource,
               (allocator<char> *)in_stack_fffffffffffffbb0);
    local_138 = local_18;
    AVar6.memoryResource._7_1_ = in_stack_fffffffffffffbaf;
    AVar6.memoryResource._0_7_ = in_stack_fffffffffffffba8;
    TextureParameterDictionary::GetFloatTexture
              (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,
               (Float)((ulong)in_stack_fffffffffffffb90 >> 0x20),AVar6);
    FloatTextureHandle::operator=
              ((FloatTextureHandle *)in_stack_fffffffffffffb80,
               (FloatTextureHandle *)in_stack_fffffffffffffb78);
    std::__cxx11::string::~string(local_128);
    std::allocator<char>::~allocator(&local_129);
  }
  bVar1 = pbrt::TaggedPointer::operator_cast_to_bool(local_d0);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_fffffffffffffbc0,(char *)in_stack_fffffffffffffbb8.memoryResource,
               (allocator<char> *)in_stack_fffffffffffffbb0);
    local_170 = local_18;
    alloc_00.memoryResource._7_1_ = in_stack_fffffffffffffbaf;
    alloc_00.memoryResource._0_7_ = in_stack_fffffffffffffba8;
    TextureParameterDictionary::GetFloatTexture
              (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,
               (Float)((ulong)in_stack_fffffffffffffb90 >> 0x20),alloc_00);
    FloatTextureHandle::operator=
              ((FloatTextureHandle *)in_stack_fffffffffffffb80,
               (FloatTextureHandle *)in_stack_fffffffffffffb78);
    std::__cxx11::string::~string(local_160);
    std::allocator<char>::~allocator(&local_161);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbc0,(char *)in_stack_fffffffffffffbb8.memoryResource,
             (allocator<char> *)in_stack_fffffffffffffbb0);
  local_1a8 = local_18;
  alloc_01.memoryResource._7_1_ = in_stack_fffffffffffffbaf;
  alloc_01.memoryResource._0_7_ = in_stack_fffffffffffffba8;
  TextureParameterDictionary::GetFloatTexture
            (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,
             (Float)((ulong)in_stack_fffffffffffffb90 >> 0x20),alloc_01);
  std::__cxx11::string::~string(local_198);
  std::allocator<char>::~allocator(&local_199);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbc0,(char *)in_stack_fffffffffffffbb8.memoryResource,
             (allocator<char> *)in_stack_fffffffffffffbb0);
  local_1e0 = local_18;
  alloc_02.memoryResource._7_1_ = in_stack_fffffffffffffbaf;
  alloc_02.memoryResource._0_7_ = in_stack_fffffffffffffba8;
  TextureParameterDictionary::GetFloatTexture
            (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,
             (Float)((ulong)in_stack_fffffffffffffb90 >> 0x20),alloc_02);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  LayeredBxDFConfig::LayeredBxDFConfig(&local_1e3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbc0,(char *)in_stack_fffffffffffffbb8.memoryResource,
             (allocator<char> *)in_stack_fffffffffffffbb0);
  iVar3 = TextureParameterDictionary::GetOneInt
                    (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,0);
  local_1e3.maxDepth = (uint8_t)iVar3;
  std::__cxx11::string::~string(local_208);
  std::allocator<char>::~allocator(&local_209);
  args_8 = &local_231;
  args_7 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbc0,(char *)in_stack_fffffffffffffbb8.memoryResource,
             (allocator<char> *)in_stack_fffffffffffffbb0);
  iVar4 = TextureParameterDictionary::GetOneInt
                    (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,0);
  local_1e3.nSamples = (uint8_t)iVar4;
  std::__cxx11::string::~string(local_230);
  std::allocator<char>::~allocator(&local_231);
  args_5 = (FloatTextureHandle *)&local_259;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbc0,(char *)in_stack_fffffffffffffbb8.memoryResource,
             (allocator<char> *)in_stack_fffffffffffffbb0);
  local_1e3.twoSided =
       TextureParameterDictionary::GetOneBool
                 (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,false);
  std::__cxx11::string::~string((string *)((long)&local_259 + 1));
  std::allocator<char>::~allocator((allocator<char> *)&local_259);
  AVar6.memoryResource = (memory_resource *)&local_289;
  this_00 = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbc0,(char *)in_stack_fffffffffffffbb8.memoryResource,
             (allocator<char> *)in_stack_fffffffffffffbb0);
  local_298 = local_18;
  alloc_03.memoryResource._7_1_ = in_stack_fffffffffffffbaf;
  alloc_03.memoryResource._0_7_ = in_stack_fffffffffffffba8;
  TextureParameterDictionary::GetFloatTexture
            (in_stack_fffffffffffffba0,in_stack_fffffffffffffb98,
             (Float)((ulong)in_stack_fffffffffffffb90 >> 0x20),alloc_03);
  spectrumType = (SpectrumType)((ulong)in_stack_fffffffffffffb98 >> 0x20);
  std::__cxx11::string::~string((string *)((long)&local_289 + 1));
  std::allocator<char>::~allocator((allocator<char> *)&local_289);
  name = (string *)local_2c1;
  args = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffbc0,(char *)in_stack_fffffffffffffbb8.memoryResource,
             (allocator<char> *)in_stack_fffffffffffffbb0);
  SpectrumHandle::TaggedPointer
            ((SpectrumHandle *)in_stack_fffffffffffffb80,in_stack_fffffffffffffb78);
  local_2d8 = local_18;
  TextureParameterDictionary::GetSpectrumTexture
            (in_stack_fffffffffffffbb0,
             (string *)CONCAT17(in_stack_fffffffffffffbaf,in_stack_fffffffffffffba8),
             (SpectrumHandle *)in_stack_fffffffffffffba0,spectrumType,in_stack_fffffffffffffbb8);
  std::__cxx11::string::~string((string *)(local_2c1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_2c1);
  bVar1 = pbrt::TaggedPointer::operator_cast_to_bool(local_2a0);
  if (!bVar1) {
    local_2ec = 0;
    local_2e8 = pstd::pmr::polymorphic_allocator<std::byte>::
                new_object<pbrt::ConstantSpectrum,float>
                          (in_stack_fffffffffffffb90,(float *)in_stack_fffffffffffffb88);
    pstd::pmr::polymorphic_allocator<std::byte>::
    new_object<pbrt::SpectrumConstantTexture,pbrt::ConstantSpectrum*>
              (in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
    SpectrumTextureHandle::TaggedPointer<pbrt::SpectrumConstantTexture>
              ((SpectrumTextureHandle *)in_stack_fffffffffffffb80,
               (SpectrumConstantTexture *)in_stack_fffffffffffffb78);
    SpectrumTextureHandle::operator=
              ((SpectrumTextureHandle *)in_stack_fffffffffffffb80,
               (SpectrumTextureHandle *)in_stack_fffffffffffffb78);
  }
  args_1 = (FloatTextureHandle *)&local_319;
  this = local_20;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this,(char *)in_stack_fffffffffffffbb8.memoryResource,
             (allocator<char> *)in_stack_fffffffffffffbb0);
  local_328 = local_18;
  TextureParameterDictionary::GetFloatTextureOrNull
            ((TextureParameterDictionary *)this_00,name,AVar6);
  std::__cxx11::string::~string((string *)((long)&local_319 + 1));
  std::allocator<char>::~allocator((allocator<char> *)&local_319);
  args_3 = (FloatTextureHandle *)&local_351;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this,(char *)args_3,(allocator<char> *)local_20);
  bVar2 = TextureParameterDictionary::GetOneBool
                    (in_stack_fffffffffffffb80,in_stack_fffffffffffffb78,false);
  std::__cxx11::string::~string((string *)((long)&local_351 + 1));
  std::allocator<char>::~allocator((allocator<char> *)&local_351);
  local_329 = bVar2 & 1;
  pCVar5 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::CoatedDiffuseMaterial,pbrt::SpectrumTextureHandle&,pbrt::FloatTextureHandle&,pbrt::FloatTextureHandle&,pbrt::FloatTextureHandle&,pbrt::SpectrumTextureHandle&,pbrt::FloatTextureHandle&,pbrt::FloatTextureHandle&,pbrt::FloatTextureHandle&,bool&,pbrt::LayeredBxDFConfig&>
                     ((polymorphic_allocator<std::byte> *)name,(SpectrumTextureHandle *)args,args_1,
                      (FloatTextureHandle *)this,args_3,(SpectrumTextureHandle *)local_20,args_5,
                      (FloatTextureHandle *)CONCAT44(iVar4,in_stack_fffffffffffffc08),
                      (FloatTextureHandle *)args_7,(bool *)args_8,
                      (LayeredBxDFConfig *)CONCAT44(iVar3,in_stack_fffffffffffffc20));
  return pCVar5;
}

Assistant:

CoatedDiffuseMaterial *CoatedDiffuseMaterial::Create(
    const TextureParameterDictionary &parameters, const FileLoc *loc, Allocator alloc) {
    SpectrumTextureHandle reflectance = parameters.GetSpectrumTexture(
        "reflectance", nullptr, SpectrumType::Reflectance, alloc);
    if (!reflectance)
        reflectance = alloc.new_object<SpectrumConstantTexture>(
            alloc.new_object<ConstantSpectrum>(0.5f));

    FloatTextureHandle uRoughness = parameters.GetFloatTextureOrNull("uroughness", alloc);
    FloatTextureHandle vRoughness = parameters.GetFloatTextureOrNull("vroughness", alloc);
    if (!uRoughness)
        uRoughness = parameters.GetFloatTexture("roughness", 0.f, alloc);
    if (!vRoughness)
        vRoughness = parameters.GetFloatTexture("roughness", 0.f, alloc);

    FloatTextureHandle thickness = parameters.GetFloatTexture("thickness", .01, alloc);
    FloatTextureHandle eta = parameters.GetFloatTexture("eta", 1.5, alloc);

    LayeredBxDFConfig config;
    config.maxDepth = parameters.GetOneInt("maxdepth", config.maxDepth);
    config.nSamples = parameters.GetOneInt("nsamples", config.nSamples);
    config.twoSided = parameters.GetOneBool("twosided", config.twoSided);

    FloatTextureHandle g = parameters.GetFloatTexture("g", 0.f, alloc);
    SpectrumTextureHandle albedo = parameters.GetSpectrumTexture(
        "albedo", nullptr, SpectrumType::Reflectance, alloc);
    if (!albedo)
        albedo = alloc.new_object<SpectrumConstantTexture>(
            alloc.new_object<ConstantSpectrum>(0.f));

    FloatTextureHandle displacement =
        parameters.GetFloatTextureOrNull("displacement", alloc);
    bool remapRoughness = parameters.GetOneBool("remaproughness", true);
    return alloc.new_object<CoatedDiffuseMaterial>(reflectance, uRoughness, vRoughness,
                                                   thickness, albedo, g, eta,
                                                   displacement, remapRoughness, config);
}